

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O1

void gain_spec_display(menu_conflict *menu,int oid,_Bool cursor,int row,int col,int width)

{
  long *plVar1;
  player_ability *ppVar2;
  
  plVar1 = (long *)menu_priv(menu);
  ppVar2 = lookup_ability("player",*(wchar_t *)(*plVar1 + (long)oid * 4),L'\0');
  c_put_str(cursor * '\b' + '\x05',ppVar2->name,row,col);
  return;
}

Assistant:

static void gain_spec_display(struct menu *menu, int oid, bool cursor, int row,
					   int col, int width)
{
	struct spec_menu_data *d = menu_priv(menu);
	int idx = d->specialties[oid];
	uint8_t attr = (cursor ? COLOUR_L_GREEN : COLOUR_GREEN);
	struct player_ability *ability = lookup_ability("player", idx, 0);

	/* Print it */
	c_put_str(attr, ability->name, row, col);

}